

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O1

void skiwi::anon_unknown_3::_treat_buffer
               (string *buff,vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens,int line_nr
               ,int column_nr,bool *is_a_symbol)

{
  size_type sVar1;
  char *value;
  int iVar2;
  int is_scientific;
  int is_real;
  int local_5c;
  e_type local_58;
  int local_54;
  int local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_5c = line_nr;
  local_54 = column_nr;
  if (*is_a_symbol == true) {
    *is_a_symbol = false;
    if (buff->_M_string_length == 0) {
      local_48._M_dataplus._M_p._0_4_ = 0;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,std::__cxx11::string&,int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)tokens,(e_type *)&local_48,
                 buff,&local_5c,&local_54);
    }
    else {
      if (*(buff->_M_dataplus)._M_p == '#') {
        local_50[1] = 0xd;
        std::operator+(&local_48,"#",buff);
        local_58 = local_54 - (int)buff->_M_string_length;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)tokens,
                   (e_type *)(local_50 + 1),&local_48,&local_5c,(int *)&local_58);
      }
      else {
        local_50[1] = 0xc;
        std::operator+(&local_48,"#",buff);
        local_58 = ~(uint)buff->_M_string_length + local_54;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)tokens,
                   (e_type *)(local_50 + 1),&local_48,&local_5c,(int *)&local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p) !=
          &local_48.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_48._M_dataplus._M_p._4_4_,(int)local_48._M_dataplus._M_p),
                        local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    sVar1 = buff->_M_string_length;
    if ((sVar1 != 0) && (value = (buff->_M_dataplus)._M_p, *value != '\0')) {
      iVar2 = is_number((int *)&local_48,local_50 + 1,value);
      local_50[0] = (int)sVar1;
      if (iVar2 == 0) {
        local_58 = T_ID;
        local_50[0] = column_nr - local_50[0];
      }
      else {
        local_50[0] = column_nr - local_50[0];
        if ((int)local_48._M_dataplus._M_p == 0) {
          local_58 = T_FIXNUM;
        }
        else {
          local_58 = T_FLONUM;
        }
      }
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,std::__cxx11::string&,int&,int>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)tokens,&local_58,buff,
                 &local_5c,local_50);
    }
  }
  buff->_M_string_length = 0;
  *(buff->_M_dataplus)._M_p = '\0';
  return;
}

Assistant:

void _treat_buffer(std::string& buff, std::vector<token>& tokens, int line_nr, int column_nr, bool& is_a_symbol)
    {
    if (is_a_symbol)
      {
      is_a_symbol = false;
      if (buff.empty())
        tokens.emplace_back(token::T_BAD, buff, line_nr, column_nr);
      else
        {
        if (buff[0] == '#') // special case. some primitives (inlined ones) can start with two ##
          {
          tokens.emplace_back(token::T_ID, "#" + buff, line_nr, column_nr - (int)buff.length());
          }
        else
          tokens.emplace_back(token::T_SYMBOL, "#" + buff, line_nr, column_nr - (int)buff.length() - 1);
        }
      }
    else if (!buff.empty() && buff[0] != '\0')
      {
      int is_real;
      int is_scientific;
      if (is_number(&is_real, &is_scientific, buff.c_str()))
        {
        if (is_real)
          tokens.emplace_back(token::T_FLONUM, buff, line_nr, column_nr - (int)buff.length());
        else
          tokens.emplace_back(token::T_FIXNUM, buff, line_nr, column_nr - (int)buff.length());
        }
      else
        {
        tokens.emplace_back(token::T_ID, buff, line_nr, column_nr - (int)buff.length());
        }
      }
    buff.clear();
    }